

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O1

void end_element_handler(void *data,char *el)

{
  coda_mem_record *type;
  coda_type_special *definition;
  long *plVar1;
  coda_type_record *pcVar2;
  coda_mem_array *pcVar3;
  bool bVar4;
  int iVar5;
  coda_mem_data *base_type;
  coda_mem_data *element;
  long lVar6;
  coda_type_text *pcVar7;
  long lVar8;
  
  if (*(int *)((long)data + 8) != 0) {
    return;
  }
  if (((*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) == 0) ||
      (*(long *)((long)data + 0x430) < 1)) ||
     (iVar5 = is_whitespace(*(char **)((long)data + 0x440),(int)*(long *)((long)data + 0x430)),
     iVar5 != 0)) {
LAB_00167ab0:
    type = *(coda_mem_record **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120);
    if (type == (coda_mem_record *)0x0) {
      definition = (coda_type_special *)
                   **(undefined8 **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20);
      if (definition->type_class == coda_special_class) {
        if (*(int *)((long)data + 0x428) != 0) {
          __assert_fail("!info->update_definition",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                        ,0x26d,"void end_element_handler(void *, const char *)");
        }
        base_type = coda_mem_data_new(definition->base_type,(coda_dynamic_type *)0x0,
                                      *(coda_product **)((long)data + 0x10),
                                      *(long *)((long)data + 0x430),
                                      *(uint8_t **)((long)data + 0x440));
        if (base_type == (coda_mem_data *)0x0) {
LAB_00167d3e:
          bVar4 = false;
          coda_XML_StopParser(*data,'\0');
          *(undefined4 *)((long)data + 8) = 1;
          element = (coda_mem_data *)0x0;
        }
        else {
          element = (coda_mem_data *)
                    coda_mem_time_new(definition,*(coda_dynamic_type **)((long)data + 0x420),
                                      (coda_dynamic_type *)base_type);
          if (element == (coda_mem_data *)0x0) {
            coda_dynamic_type_delete((coda_dynamic_type *)base_type);
            goto LAB_00167d3e;
          }
          bVar4 = true;
        }
        if (bVar4) {
LAB_00167d5a:
          *(undefined8 *)((long)data + 0x420) = 0;
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
      }
      else {
        element = coda_mem_data_new((coda_type *)definition,
                                    *(coda_dynamic_type **)((long)data + 0x420),
                                    *(coda_product **)((long)data + 0x10),
                                    *(long *)((long)data + 0x430),*(uint8_t **)((long)data + 0x440))
        ;
        if (element != (coda_mem_data *)0x0) goto LAB_00167d5a;
        bVar4 = false;
        coda_XML_StopParser(*data,'\0');
        *(undefined4 *)((long)data + 8) = 1;
        element = (coda_mem_data *)0x0;
      }
      if (!bVar4) {
        return;
      }
    }
    else {
      if (*(int *)((long)data + 0x428) == 0) {
        iVar5 = coda_mem_record_validate(type);
        if (iVar5 != 0) goto LAB_00167dc4;
        lVar6 = *(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120);
        if (0 < *(long *)(lVar6 + 0x20)) {
          lVar8 = 0;
          do {
            pcVar3 = *(coda_mem_array **)(*(long *)(lVar6 + 0x28) + lVar8 * 8);
            if (((pcVar3 != (coda_mem_array *)0x0) &&
                (pcVar3->definition->type_class == coda_array_class)) &&
               (pcVar3->definition->format == coda_format_xml)) {
              iVar5 = coda_mem_array_validate(pcVar3);
              if (iVar5 != 0) goto LAB_00167dc4;
              if ((pcVar3->num_elements == 0) &&
                 (*(char *)(*(long *)(*(long *)(*(long *)(*(long *)((long)data +
                                                                   (long)*(int *)((long)data + 0x18)
                                                                   * 8 + 0x120) + 8) + 0x50) +
                                     lVar8 * 8) + 0x1c) != '\0')) {
                coda_mem_type_delete((coda_dynamic_type *)pcVar3);
                *(undefined8 *)
                 (*(long *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) +
                           0x28) + lVar8 * 8) = 0;
              }
            }
            lVar8 = lVar8 + 1;
            lVar6 = *(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120);
          } while (lVar8 < *(long *)(lVar6 + 0x20));
        }
      }
      element = *(coda_mem_data **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120);
      *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) = 0;
    }
    if (*(long *)((long)data + 0x420) != 0) {
      __assert_fail("info->attributes == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                    ,0x2b6,"void end_element_handler(void *, const char *)");
    }
    lVar8 = (long)*(int *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x220);
    lVar6 = *(long *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x118) + 0x28);
    pcVar3 = *(coda_mem_array **)(lVar6 + lVar8 * 8);
    if (pcVar3 == (coda_mem_array *)0x0) {
      *(coda_mem_data **)(lVar6 + lVar8 * 8) = element;
    }
    else {
      if ((pcVar3->definition->type_class != coda_array_class) ||
         (pcVar3->definition->format != coda_format_xml)) {
        __assert_fail("parent->field_type[index]->definition->type_class == coda_array_class && parent->field_type[index]->definition->format == coda_format_xml"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x2be,"void end_element_handler(void *, const char *)");
      }
      iVar5 = coda_mem_array_add_element(pcVar3,(coda_dynamic_type *)element);
      if (iVar5 != 0) {
        coda_dynamic_type_delete((coda_dynamic_type *)element);
        goto LAB_00167dc4;
      }
    }
    *(int *)((long)data + 0x18) = *(int *)((long)data + 0x18) + -1;
    *(undefined8 *)((long)data + 0x430) = 0;
  }
  else {
    if (*(int *)((long)data + 0x428) == 0) {
      __assert_fail("info->update_definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                    ,0x250,"void end_element_handler(void *, const char *)");
    }
    lVar8 = (long)*(int *)((long)data + 0x18);
    lVar6 = *(long *)((long)data + lVar8 * 8 + 0x120);
    if (*(long *)(*(long *)(lVar6 + 8) + 0x48) < 1) {
      *(undefined8 *)((long)data + 0x420) = *(undefined8 *)(lVar6 + 0x18);
      *(undefined8 *)(*(long *)((long)data + lVar8 * 8 + 0x120) + 0x18) = 0;
      plVar1 = *(long **)((long)data + lVar8 * 8 + 0x20);
      if ((((int *)*plVar1)[2] != 0) || (*(int *)*plVar1 != 2)) {
        __assert_fail("(*definition)->type_class == coda_record_class && (*definition)->format == coda_format_xml"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x46,"int convert_to_text(coda_type **)");
      }
      pcVar7 = coda_type_text_new(coda_format_xml);
      if (pcVar7 != (coda_type_text *)0x0) {
        pcVar2 = *(coda_type_record **)(*plVar1 + 0x30);
        if (pcVar2 != (coda_type_record *)0x0) {
          pcVar7->attributes = pcVar2;
          pcVar2->retain_count = pcVar2->retain_count + 1;
        }
        coda_type_release((coda_type *)*plVar1);
        *plVar1 = (long)pcVar7;
        if (pcVar7 != (coda_type_text *)0x0) {
          coda_dynamic_type_delete
                    (*(coda_dynamic_type **)
                      ((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120));
          *(undefined8 *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) = 0;
          goto LAB_00167ab0;
        }
      }
    }
    else {
      coda_set_error(-300,"mixed content for element \'%s\' is not supported",
                     *(undefined8 *)((long)data + lVar8 * 8 + 800));
    }
LAB_00167dc4:
    coda_XML_StopParser(*data,'\0');
    *(undefined4 *)((long)data + 8) = 1;
  }
  return;
}

Assistant:

static void XMLCALL end_element_handler(void *data, const char *el)
{
    parser_info *info = (parser_info *)data;
    coda_mem_record *parent;
    coda_mem_type *type;
    int index;

    (void)el;

    if (info->abort_parser)
    {
        return;
    }

    /* we are dealing with a record if info->record[info->depth] != NULL */
    if (info->record[info->depth] != NULL && info->value_length > 0 && !is_whitespace(info->value, info->value_length))
    {
        assert(info->update_definition);        /* other case is already handled in character_data_handler() */
        if (((coda_type_record *)info->record[info->depth]->definition)->num_fields > 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "mixed content for element '%s' is not supported",
                           info->xml_name[info->depth]);
            abort_parser(info);
            return;
        }
        /* convert definition from record to text */
        info->attributes = info->record[info->depth]->attributes;
        info->record[info->depth]->attributes = NULL;
        if (convert_to_text(info->definition[info->depth]) != 0)
        {
            abort_parser(info);
            return;
        }
        /* delete the record we created in start_element_handler() */
        coda_dynamic_type_delete((coda_dynamic_type *)info->record[info->depth]);
        info->record[info->depth] = NULL;
    }

    if (info->record[info->depth] == NULL)
    {
        coda_type *definition = *info->definition[info->depth];

        if (definition->type_class == coda_special_class)
        {
            coda_dynamic_type *base_type;

            assert(!info->update_definition);

            base_type = (coda_dynamic_type *)coda_mem_data_new(((coda_type_special *)definition)->base_type, NULL,
                                                               (coda_product *)info->product, info->value_length,
                                                               (uint8_t *)info->value);
            if (base_type == NULL)
            {
                abort_parser(info);
                return;
            }

            type = (coda_mem_type *)coda_mem_time_new((coda_type_special *)definition, info->attributes, base_type);
            if (type == NULL)
            {
                coda_dynamic_type_delete(base_type);
                abort_parser(info);
                return;
            }
        }
        else
        {
            type = (coda_mem_type *)coda_mem_data_new(definition, info->attributes, (coda_product *)info->product,
                                                      info->value_length, (uint8_t *)info->value);
            if (type == NULL)
            {
                abort_parser(info);
                return;
            }
        }
        info->attributes = NULL;
    }
    else
    {
        if (!info->update_definition)
        {
            int i;

            if (coda_mem_record_validate(info->record[info->depth]) != 0)
            {
                abort_parser(info);
                return;
            }

            /* also validate all fields that are arrays of xml elements */
            for (i = 0; i < info->record[info->depth]->num_fields; i++)
            {
                coda_dynamic_type *field_type = info->record[info->depth]->field_type[i];

                if (field_type != NULL)
                {
                    if (field_type->definition->type_class == coda_array_class &&
                        field_type->definition->format == coda_format_xml)
                    {
                        if (coda_mem_array_validate((coda_mem_array *)field_type) != 0)
                        {
                            abort_parser(info);
                            return;
                        }
                        /* if the array is empty and the field is optional then remove the array */
                        if (((coda_mem_array *)field_type)->num_elements == 0 &&
                            info->record[info->depth]->definition->field[i]->optional)
                        {
                            coda_mem_type_delete(field_type);
                            info->record[info->depth]->field_type[i] = NULL;
                        }
                    }
                }
            }
        }
        type = (coda_mem_type *)info->record[info->depth];
        info->record[info->depth] = NULL;
    }

    assert(info->attributes == NULL);

    parent = info->record[info->depth - 1];
    index = info->index[info->depth];
    if (parent->field_type[index] != NULL)
    {
        /* add the child element to the array */
        assert(parent->field_type[index]->definition->type_class == coda_array_class &&
               parent->field_type[index]->definition->format == coda_format_xml);
        if (coda_mem_array_add_element((coda_mem_array *)parent->field_type[index], (coda_dynamic_type *)type) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)type);
            abort_parser(info);
            return;
        }
    }
    else
    {
        parent->field_type[index] = (coda_dynamic_type *)type;
    }

    info->depth--;
    info->value_length = 0;
}